

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwen2vl-cli.cpp
# Opt level: O0

llava_context * llava_init_context(common_params *params,llama_model *model)

{
  ulong uVar1;
  clip_ctx *pcVar2;
  llama_context *plVar3;
  common_log *log;
  llama_model *in_RSI;
  long in_RDI;
  llava_context *ctx_llava;
  llama_context *ctx_llama;
  llama_context_params ctx_params;
  clip_ctx *ctx_clip;
  string prompt;
  char *clip_path;
  int in_stack_fffffffffffffdfc;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  string local_40 [32];
  undefined8 local_20;
  llama_model *local_18;
  long local_10;
  llava_context *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_20 = std::__cxx11::string::c_str();
  std::__cxx11::string::string(local_40,(string *)(local_10 + 0xe20));
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    std::__cxx11::string::operator=(local_40,"describe the image in detail.");
  }
  pcVar2 = clip_model_load((char *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                           in_stack_fffffffffffffdfc);
  common_context_params_to_llama
            ((common_params *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  plVar3 = (llama_context *)llama_init_from_model(local_18);
  if (plVar3 == (llama_context *)0x0) {
    if (-1 < common_log_verbosity_thold) {
      log = common_log_main();
      common_log_add(log,GGML_LOG_LEVEL_ERROR,"%s: failed to create the llama_context\n",
                     "llava_init_context");
    }
    local_8 = (llava_context *)0x0;
  }
  else {
    local_8 = (llava_context *)malloc(0x18);
    local_8->ctx_llama = plVar3;
    local_8->ctx_clip = pcVar2;
    local_8->model = local_18;
  }
  std::__cxx11::string::~string(local_40);
  return local_8;
}

Assistant:

static struct llava_context * llava_init_context(common_params * params, llama_model * model) {
    const char * clip_path = params->mmproj.path.c_str();

    auto prompt = params->prompt;
    if (prompt.empty()) {
        prompt = "describe the image in detail.";
    }

    auto ctx_clip = clip_model_load(clip_path, GGML_LOG_LEVEL_INFO);

    llama_context_params ctx_params = common_context_params_to_llama(*params);
    ctx_params.n_ctx           = params->n_ctx < 2048 ? 2048 : params->n_ctx; // we need a longer context size to process image embeddings

    llama_context * ctx_llama = llama_init_from_model(model, ctx_params);

    if (ctx_llama == NULL) {
        LOG_ERR("%s: failed to create the llama_context\n" , __func__);
        return NULL;
    }

    auto * ctx_llava = (struct llava_context *)malloc(sizeof(llava_context));

    ctx_llava->ctx_llama = ctx_llama;
    ctx_llava->ctx_clip = ctx_clip;
    ctx_llava->model = model;
    return ctx_llava;
}